

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,LogLevel ll)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if (ll == Error) {
    __s = "[Error] ";
    __a = &local_a;
  }
  else if (ll == Warning) {
    __s = "[Warning] ";
    __a = &local_9;
  }
  else {
    __s = "[Log] ";
    __a = &local_b;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const LogLevel ll) {
	switch (ll) {
		case LogLevel::Warning:
			return "[Warning] ";
		case LogLevel::Error:
			return "[Error] ";
	}
	return "[Log] ";
}